

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ssize_t __thiscall TextField::read(TextField *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  size_t __nbytes_03;
  void *__buf_00;
  undefined4 in_register_00000034;
  HorizontalAlignment local_1c;
  uint8_t *puStack_18;
  int tmp;
  uint8_t *buf_local;
  TextField *this_local;
  
  puStack_18 = (uint8_t *)CONCAT44(in_register_00000034,__fd);
  buf_local = (uint8_t *)this;
  iVar1 = Util::readString(puStack_18,&this->text);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readString(puStack_18,&this->placeholder);
  puStack_18 = puStack_18 + iVar1;
  sVar2 = FontData::read((int)puStack_18,&this->textFont,__nbytes_00);
  puStack_18 = puStack_18 + (int)sVar2;
  sVar2 = Color::read((int)puStack_18,&this->textColor,__nbytes_01);
  puStack_18 = puStack_18 + (int)sVar2;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->horizontalAlignment = local_1c;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->verticalAlignment = local_1c;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->textTrimming = local_1c;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->lineBreak = local_1c;
  iVar1 = Util::readInt32(puStack_18,&this->textInputMode);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readBool(puStack_18,&this->passwordMode);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readInt32(puStack_18,&this->imeWindowMode);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readString(puStack_18,&this->imeWindowTitle);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readInt32(puStack_18,&this->imeEnterLabel);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readBool(puStack_18,&this->acceptsReturn);
  puStack_18 = puStack_18 + iVar1;
  sVar2 = Color::read((int)puStack_18,&this->placeHolderColor,__nbytes_02);
  puStack_18 = puStack_18 + (int)sVar2;
  sVar2 = FontData::read((int)puStack_18,&this->placeholderFont,__nbytes_03);
  puStack_18 = puStack_18 + (int)sVar2;
  sVar2 = Widget::read(&this->super_Widget,(int)puStack_18,__buf_00,(long)(int)sVar2);
  return sVar2;
}

Assistant:

uint8_t* TextField::read(uint8_t* buf)
{
	buf += Util::readString(buf, text);
	buf += Util::readString(buf, placeholder);
	buf += FontData::read(buf, textFont);
	buf += Color::read(buf, textColor);

	int tmp;
	buf += Util::readInt32(buf, tmp);
	horizontalAlignment = static_cast<HorizontalAlignment>(tmp);
	buf += Util::readInt32(buf, tmp);
	verticalAlignment = static_cast<VerticalAlignment>(tmp);
	buf += Util::readInt32(buf, tmp);
	textTrimming = static_cast<TextTrimming>(tmp);
	buf += Util::readInt32(buf, tmp);
	lineBreak = static_cast<LineBreak>(tmp);
	buf += Util::readInt32(buf, textInputMode);
	buf += Util::readBool(buf, passwordMode);
	buf += Util::readInt32(buf, imeWindowMode);
	buf += Util::readString(buf, imeWindowTitle);
	buf += Util::readInt32(buf, imeEnterLabel);
	buf += Util::readBool(buf, acceptsReturn);
	buf += Color::read(buf, placeHolderColor);
	buf += FontData::read(buf, placeholderFont);

	return Widget::read(buf);
}